

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_pack_s16_s8(c_v64 a,c_v64 b)

{
  c_v64 cVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  c_v64 b_local;
  c_v64 a_local;
  c_v64 t;
  
  a_local.u16[3] = a.u16[3];
  if (a_local.s16[3] < 0x80) {
    if (a_local.s16[3] < -0x80) {
      a_local.u16[3] = 0xff80;
    }
    uVar2 = (undefined1)a_local.u16[3];
  }
  else {
    uVar2 = 0x7f;
  }
  a_local.u16[2] = a.u16[2];
  if (a_local.s16[2] < 0x80) {
    if (a_local.s16[2] < -0x80) {
      a_local.u16[2] = 0xff80;
    }
    uVar3 = (undefined1)a_local.u16[2];
  }
  else {
    uVar3 = 0x7f;
  }
  a_local.u16[1] = a.u16[1];
  if (a_local.s16[1] < 0x80) {
    if (a_local.s16[1] < -0x80) {
      a_local.u16[1] = 0xff80;
    }
    uVar4 = (undefined1)a_local.u16[1];
  }
  else {
    uVar4 = 0x7f;
  }
  a_local.u16[0] = a.u16[0];
  if (a_local.s16[0] < 0x80) {
    if (a_local.s16[0] < -0x80) {
      a_local.u16[0] = 0xff80;
    }
    uVar5 = (undefined1)a_local.u16[0];
  }
  else {
    uVar5 = 0x7f;
  }
  b_local.u16[3] = b.u16[3];
  if (b_local.s16[3] < 0x80) {
    if (b_local.s16[3] < -0x80) {
      b_local.u16[3] = 0xff80;
    }
    uVar6 = (undefined1)b_local.u16[3];
  }
  else {
    uVar6 = 0x7f;
  }
  b_local.u16[2] = b.u16[2];
  if (b_local.s16[2] < 0x80) {
    if (b_local.s16[2] < -0x80) {
      b_local.u16[2] = 0xff80;
    }
    uVar7 = (undefined1)b_local.u16[2];
  }
  else {
    uVar7 = 0x7f;
  }
  b_local.u16[1] = b.u16[1];
  if (b_local.s16[1] < 0x80) {
    if (b_local.s16[1] < -0x80) {
      b_local.u16[1] = 0xff80;
    }
    uVar8 = (undefined1)b_local.u16[1];
  }
  else {
    uVar8 = 0x7f;
  }
  b_local.u16[0] = b.u16[0];
  if (b_local.s16[0] < 0x80) {
    if (b_local.s16[0] < -0x80) {
      b_local.u16[0] = 0xff80;
    }
    uVar9 = (undefined1)b_local.u16[0];
  }
  else {
    uVar9 = 0x7f;
  }
  cVar1.u8[1] = uVar8;
  cVar1.u8[0] = uVar9;
  cVar1.u8[2] = uVar7;
  cVar1.u8[3] = uVar6;
  cVar1.u8[4] = uVar5;
  cVar1.u8[5] = uVar4;
  cVar1.u8[6] = uVar3;
  cVar1.u8[7] = uVar2;
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_pack_s16_s8(c_v64 a, c_v64 b) {
  c_v64 t;
  if (CONFIG_BIG_ENDIAN) {
    c_v64 u = a;
    a = b;
    b = u;
  }
  t.s8[7] = SIMD_CLAMP(a.s16[3], -128, 127);
  t.s8[6] = SIMD_CLAMP(a.s16[2], -128, 127);
  t.s8[5] = SIMD_CLAMP(a.s16[1], -128, 127);
  t.s8[4] = SIMD_CLAMP(a.s16[0], -128, 127);
  t.s8[3] = SIMD_CLAMP(b.s16[3], -128, 127);
  t.s8[2] = SIMD_CLAMP(b.s16[2], -128, 127);
  t.s8[1] = SIMD_CLAMP(b.s16[1], -128, 127);
  t.s8[0] = SIMD_CLAMP(b.s16[0], -128, 127);
  return t;
}